

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O1

string * __thiscall
flow::HandlerCallInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,HandlerCallInstr *this)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"handler","");
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HandlerCallInstr::to_string() const {
  return formatOne("handler");
}